

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifcvn(bifcxdef *ctx,int argc)

{
  char cVar1;
  ushort uVar2;
  runsdef *prVar3;
  runcxdef *ctx_00;
  ushort *puVar4;
  bool bVar5;
  ushort uVar6;
  ushort *puVar7;
  ushort **ppuVar8;
  ushort *puVar9;
  anon_union_8_4_1dda36f5_for_runsv aVar10;
  long lVar11;
  dattyp typ;
  long lVar12;
  ulong uVar13;
  ushort *puVar14;
  uint uVar15;
  uint uVar16;
  runsdef val;
  runsdef local_40;
  ulong uVar17;
  
  prVar3 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar3 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar3[-1].runstyp != '\x03') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ef);
  }
  puVar4 = (ushort *)(ctx_00->runcxsp->runsv).runsvstr;
  uVar2 = *puVar4;
  uVar15 = uVar2 - 2;
  puVar14 = puVar4 + 1;
  if (uVar2 == 6) {
LAB_0021178e:
    if (*(int *)puVar14 == 0x65757274) {
      typ = 8;
      goto LAB_002118d1;
    }
LAB_0021179b:
    if (uVar15 != 0) {
LAB_002117a4:
      lVar11 = 0;
      do {
        cVar1 = *(char *)((long)puVar4 + lVar11 + 2);
        if (((long)cVar1 < 0) ||
           (ppuVar8 = __ctype_b_loc(), (*(byte *)((long)*ppuVar8 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) {
          lVar12 = (ulong)uVar2 - lVar11;
          uVar17 = lVar12 - 2;
          uVar15 = (uint)uVar17;
          puVar14 = (ushort *)((long)puVar4 + lVar11 + 2);
          if (cVar1 != '-') {
            bVar5 = true;
            goto LAB_00211885;
          }
          uVar13 = lVar12 - 3;
          puVar7 = (ushort *)((long)puVar4 + lVar11 + 3);
          goto LAB_00211824;
        }
        lVar11 = lVar11 + 1;
      } while (uVar2 - 2 != (int)lVar11);
      bVar5 = true;
      uVar15 = 0;
      puVar14 = (ushort *)((long)puVar4 + (ulong)(uVar2 - 3) + 3);
      goto LAB_00211885;
    }
  }
  else {
    if (uVar2 != 5) goto LAB_0021179b;
    if ((char)puVar4[2] == 'l' && *puVar14 == 0x696e) {
      typ = 5;
      goto LAB_002118d1;
    }
    if ((ulong)uVar2 != 2) {
      if (uVar2 == 6) goto LAB_0021178e;
      goto LAB_002117a4;
    }
  }
  bVar5 = true;
  goto LAB_00211885;
  while( true ) {
    puVar14 = (ushort *)((long)puVar14 + 1);
    uVar16 = (int)uVar17 - 1;
    uVar17 = (ulong)uVar16;
    uVar6 = *puVar9;
    if ((long)(char)uVar6 < 0) goto LAB_0021187d;
    ppuVar8 = __ctype_b_loc();
    puVar7 = (ushort *)((long)puVar9 + 1);
    if ((*(byte *)((long)*ppuVar8 + (long)(char)uVar6 * 2 + 1) & 0x20) == 0) break;
LAB_00211824:
    puVar9 = puVar7;
    uVar15 = (uint)uVar13;
    uVar13 = (ulong)(uVar15 - 1);
    if (uVar15 == 0) {
      puVar14 = (ushort *)((long)puVar4 + (ulong)(uVar2 - 3) + 3);
      uVar16 = 0;
LAB_0021187d:
      uVar15 = uVar16;
      bVar5 = false;
      goto LAB_00211885;
    }
  }
  bVar5 = false;
  puVar14 = puVar9;
LAB_00211885:
  if (uVar15 == 0) {
    aVar10.runsvnum = 0;
  }
  else {
    ppuVar8 = __ctype_b_loc();
    lVar11 = 0;
    aVar10.runsvnum = 0;
    do {
      if ((*(byte *)((long)*ppuVar8 + (ulong)*(byte *)((long)puVar14 + lVar11) * 2 + 1) & 8) == 0)
      break;
      aVar10.runsvstr =
           (uchar *)((ulong)*(byte *)((long)puVar14 + lVar11) + aVar10.runsvnum * 10 + -0x30);
      lVar11 = lVar11 + 1;
    } while (uVar15 != (uint)lVar11);
  }
  local_40.runsv.runsvnum = -aVar10.runsvnum;
  if (bVar5) {
    local_40.runsv = aVar10;
  }
  typ = 1;
LAB_002118d1:
  runpush(ctx_00,typ,&local_40);
  return;
}

Assistant:

void bifcvn(bifcxdef *ctx, int argc)
{
    runsdef  val;
    uchar   *p;
    int      len;
    int      typ;
    long     acc;
    int      neg;
    
    bifcntargs(ctx, 1, argc);
    p = runpopstr(ctx->bifcxrun);
    len = osrp2(p) - 2;
    p += 2;
    
    if (len == 3 && !memcmp(p, "nil", (size_t)3))
        typ = DAT_NIL;
    else if (len == 4 && !memcmp(p, "true", (size_t)4))
        typ = DAT_TRUE;
    else
    {
        typ = DAT_NUMBER;
        for ( ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        if (len != 0 && *p == '-')
        {
            neg = TRUE;
            for (++p, --len ; len != 0 && t_isspace(*p) ; ++p, --len) ;
        }
        else neg = FALSE;

        /* accumulate the number digit by digit */
        for (acc = 0 ; len != 0 && isdigit(*p) ; ++p, --len)
            acc = (acc << 3) + (acc << 1) + ((*p) - '0');

        if (neg) acc = -acc;
        val.runsv.runsvnum = acc;
    }
    
    runpush(ctx->bifcxrun, typ, &val);
}